

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void dxil_spv::scrub_rov_lock_regions
               (CFGNode *node,bool preserve_first_begin,bool preserve_last_end)

{
  pointer ppOVar1;
  size_t __n;
  undefined7 in_register_00000031;
  pointer ppOVar2;
  long lVar3;
  pointer ppOVar4;
  pointer ppOVar5;
  bool bVar6;
  
  ppOVar5 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000031,preserve_first_begin) != 0) {
    ppOVar4 = (node->ir).operations.
              super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar3 = (long)ppOVar4 - (long)ppOVar5 >> 5;
    ppOVar2 = ppOVar5;
    if (0 < lVar3) {
      ppOVar2 = (pointer)(((long)ppOVar4 - (long)ppOVar5 & 0xffffffffffffffe0U) + (long)ppOVar5);
      lVar3 = lVar3 + 1;
      ppOVar5 = ppOVar5 + 2;
      do {
        if (ppOVar5[-2]->op == OpBeginInvocationInterlockEXT) {
          ppOVar5 = ppOVar5 + -2;
          goto LAB_00133d51;
        }
        if (ppOVar5[-1]->op == OpBeginInvocationInterlockEXT) {
          ppOVar5 = ppOVar5 + -1;
          goto LAB_00133d51;
        }
        if ((*ppOVar5)->op == OpBeginInvocationInterlockEXT) goto LAB_00133d51;
        if (ppOVar5[1]->op == OpBeginInvocationInterlockEXT) {
          ppOVar5 = ppOVar5 + 1;
          goto LAB_00133d51;
        }
        lVar3 = lVar3 + -1;
        ppOVar5 = ppOVar5 + 4;
      } while (1 < lVar3);
    }
    lVar3 = (long)ppOVar4 - (long)ppOVar2 >> 3;
    if (lVar3 == 1) {
LAB_00133d2f:
      ppOVar5 = ppOVar2;
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        ppOVar5 = ppOVar4;
      }
    }
    else if (lVar3 == 2) {
LAB_00133d20:
      ppOVar5 = ppOVar2;
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 1;
        goto LAB_00133d2f;
      }
    }
    else {
      ppOVar5 = ppOVar4;
      if ((lVar3 == 3) && (ppOVar5 = ppOVar2, (*ppOVar2)->op != OpBeginInvocationInterlockEXT)) {
        ppOVar2 = ppOVar2 + 1;
        goto LAB_00133d20;
      }
    }
LAB_00133d51:
    if (ppOVar5 == ppOVar4) {
      __assert_fail("begin_itr != node->ir.operations.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x1cd,"void dxil_spv::scrub_rov_begin_lock(CFGNode *, bool)");
    }
    ppOVar5 = ppOVar5 + 1;
  }
  ppOVar4 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)ppOVar4 - (long)ppOVar5 >> 5;
  ppOVar2 = ppOVar5;
  if (0 < lVar3) {
    ppOVar2 = (pointer)(((long)ppOVar4 - (long)ppOVar5 & 0xffffffffffffffe0U) + (long)ppOVar5);
    lVar3 = lVar3 + 1;
    ppOVar5 = ppOVar5 + 2;
    do {
      if (ppOVar5[-2]->op == OpBeginInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + -2;
        goto LAB_00133e2a;
      }
      if (ppOVar5[-1]->op == OpBeginInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + -1;
        goto LAB_00133e2a;
      }
      if ((*ppOVar5)->op == OpBeginInvocationInterlockEXT) goto LAB_00133e2a;
      if (ppOVar5[1]->op == OpBeginInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + 1;
        goto LAB_00133e2a;
      }
      lVar3 = lVar3 + -1;
      ppOVar5 = ppOVar5 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)ppOVar4 - (long)ppOVar2 >> 3;
  if (lVar3 == 1) {
LAB_00133e08:
    ppOVar5 = ppOVar2;
    if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
      ppOVar5 = ppOVar4;
    }
  }
  else if (lVar3 == 2) {
LAB_00133df9:
    ppOVar5 = ppOVar2;
    if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
      ppOVar2 = ppOVar2 + 1;
      goto LAB_00133e08;
    }
  }
  else {
    ppOVar5 = ppOVar4;
    if ((lVar3 == 3) && (ppOVar5 = ppOVar2, (*ppOVar2)->op != OpBeginInvocationInterlockEXT)) {
      ppOVar2 = ppOVar2 + 1;
      goto LAB_00133df9;
    }
  }
LAB_00133e2a:
  ppOVar2 = ppOVar5 + 1;
  if (ppOVar2 != ppOVar4 && ppOVar5 != ppOVar4) {
    do {
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        *ppOVar5 = *ppOVar2;
        ppOVar5 = ppOVar5 + 1;
      }
      ppOVar2 = ppOVar2 + 1;
    } while (ppOVar2 != ppOVar4);
  }
  if (ppOVar5 !=
      (node->ir).operations.
      super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (node->ir).operations.
    super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppOVar5;
  }
  ppOVar5 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppOVar4 = ppOVar5;
  if (preserve_last_end) {
    lVar3 = (long)ppOVar5 -
            (long)(node->ir).operations.
                  super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3;
    ppOVar2 = ppOVar5;
    do {
      bVar6 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      ppOVar4 = ppOVar5;
      if (bVar6) break;
      ppOVar1 = ppOVar2 + -1;
      ppOVar2 = ppOVar2 + -1;
      ppOVar4 = ppOVar2;
    } while ((*ppOVar1)->op != OpEndInvocationInterlockEXT);
  }
  ppOVar5 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)ppOVar4 - (long)ppOVar5 >> 5;
  ppOVar2 = ppOVar5;
  if (0 < lVar3) {
    ppOVar2 = (pointer)(((long)ppOVar4 - (long)ppOVar5 & 0xffffffffffffffe0U) + (long)ppOVar5);
    lVar3 = lVar3 + 1;
    ppOVar5 = ppOVar5 + 2;
    do {
      if (ppOVar5[-2]->op == OpEndInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + -2;
        goto LAB_00133f60;
      }
      if (ppOVar5[-1]->op == OpEndInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + -1;
        goto LAB_00133f60;
      }
      if ((*ppOVar5)->op == OpEndInvocationInterlockEXT) goto LAB_00133f60;
      if (ppOVar5[1]->op == OpEndInvocationInterlockEXT) {
        ppOVar5 = ppOVar5 + 1;
        goto LAB_00133f60;
      }
      lVar3 = lVar3 + -1;
      ppOVar5 = ppOVar5 + 4;
    } while (1 < lVar3);
  }
  lVar3 = (long)ppOVar4 - (long)ppOVar2 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      ppOVar5 = ppOVar4;
      if ((lVar3 != 3) || (ppOVar5 = ppOVar2, (*ppOVar2)->op == OpEndInvocationInterlockEXT))
      goto LAB_00133f60;
      ppOVar2 = ppOVar2 + 1;
    }
    ppOVar5 = ppOVar2;
    if ((*ppOVar2)->op == OpEndInvocationInterlockEXT) goto LAB_00133f60;
    ppOVar2 = ppOVar2 + 1;
  }
  ppOVar5 = ppOVar2;
  if ((*ppOVar2)->op != OpEndInvocationInterlockEXT) {
    ppOVar5 = ppOVar4;
  }
LAB_00133f60:
  ppOVar2 = ppOVar5;
  if (ppOVar5 != ppOVar4) {
    while (ppOVar2 = ppOVar2 + 1, ppOVar2 != ppOVar4) {
      if ((*ppOVar2)->op != OpEndInvocationInterlockEXT) {
        *ppOVar5 = *ppOVar2;
        ppOVar5 = ppOVar5 + 1;
      }
    }
  }
  if (ppOVar5 != ppOVar4) {
    __n = (long)(node->ir).operations.
                super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar4;
    if (__n != 0) {
      memmove(ppOVar5,ppOVar4,__n);
    }
    ppOVar2 = (node->ir).operations.
              super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppOVar5 = (pointer)((long)ppOVar5 + ((long)ppOVar2 - (long)ppOVar4));
    if (ppOVar2 != ppOVar5) {
      (node->ir).operations.
      super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppOVar5;
    }
  }
  return;
}

Assistant:

static void scrub_rov_lock_regions(CFGNode *node, bool preserve_first_begin, bool preserve_last_end)
{
	scrub_rov_begin_lock(node, preserve_first_begin);
	scrub_rov_end_lock(node, preserve_last_end);
}